

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int units_search(void *vkey,void *ventry)

{
  size_t offset;
  unit *entry;
  size_t *key;
  void *ventry_local;
  void *vkey_local;
  undefined4 local_4;
  
  if (*vkey < *(ulong *)(*ventry + 0x18)) {
    local_4 = -1;
  }
  else if (*vkey < *(ulong *)(*ventry + 0x20)) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
units_search (const void *vkey, const void *ventry)
{
  const size_t *key = (const size_t *) vkey;
  const struct unit *entry = *((const struct unit *const *) ventry);
  size_t offset;

  offset = *key;
  if (offset < entry->low_offset)
    return -1;
  else if (offset >= entry->high_offset)
    return 1;
  else
    return 0;
}